

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,ZeroCopyOutputStream *output)

{
  bool bVar1;
  undefined1 local_48 [8];
  TextGenerator generator;
  ZeroCopyOutputStream *output_local;
  UnknownFieldSet *unknown_fields_local;
  Printer *this_local;
  
  generator._32_8_ = output;
  TextGenerator::TextGenerator((TextGenerator *)local_48,output,this->initial_indent_level_);
  PrintUnknownFields(this,unknown_fields,(BaseTextGenerator *)local_48,10);
  bVar1 = TextGenerator::failed((TextGenerator *)local_48);
  TextGenerator::~TextGenerator((TextGenerator *)local_48);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields,
    io::ZeroCopyOutputStream* output) const {
  TextGenerator generator(output, initial_indent_level_);

  PrintUnknownFields(unknown_fields, &generator, kUnknownFieldRecursionLimit);

  // Output false if the generator failed internally.
  return !generator.failed();
}